

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

string * __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::getType_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<pbrt::syntactic::Texture> *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->type);
  return __return_storage_ptr__;
}

Assistant:

virtual size_t getSize() const { return 1; }